

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O3

void __thiscall Iex_3_2::BaseExc::BaseExc(BaseExc *this,char *s)

{
  size_t sVar1;
  
  *(undefined ***)this = &PTR__EdircorruptedExc_00174618;
  if (s == (char *)0x0) {
    s = "";
  }
  (this->_message)._M_dataplus._M_p = (pointer)&(this->_message).field_2;
  sVar1 = strlen(s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_message,s,s + sVar1);
  if ((anonymous_namespace)::currentStackTracer_abi_cxx11_ == (code *)0x0) {
    (this->_stackTrace)._M_dataplus._M_p = (pointer)&(this->_stackTrace).field_2;
    (this->_stackTrace)._M_string_length = 0;
    (this->_stackTrace).field_2._M_local_buf[0] = '\0';
  }
  else {
    (*(anonymous_namespace)::currentStackTracer_abi_cxx11_)(&this->_stackTrace);
  }
  return;
}

Assistant:

BaseExc::BaseExc (const char* s)
    : _message (s ? s : "")
    , _stackTrace (currentStackTracer ? currentStackTracer () : std::string ())
{}